

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaPrs.h
# Opt level: O0

void Prs_ManVecFree(Vec_Ptr_t *vPrs)

{
  int iVar1;
  Prs_Ntk_t *p;
  undefined4 local_1c;
  int i;
  Prs_Ntk_t *pNtk;
  Vec_Ptr_t *vPrs_local;
  
  for (local_1c = 0; iVar1 = Vec_PtrSize(vPrs), local_1c < iVar1; local_1c = local_1c + 1) {
    p = (Prs_Ntk_t *)Vec_PtrEntry(vPrs,local_1c);
    Prs_NtkFree(p);
  }
  Vec_PtrFree(vPrs);
  return;
}

Assistant:

static inline void Prs_ManVecFree( Vec_Ptr_t * vPrs )
{
    Prs_Ntk_t * pNtk; int i;
    Vec_PtrForEachEntry( Prs_Ntk_t *, vPrs, pNtk, i )
        Prs_NtkFree( pNtk );
    Vec_PtrFree( vPrs );
}